

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfault.h
# Opt level: O2

string * logfault::Handler::LevelName_abi_cxx11_(LogLevel level)

{
  int iVar1;
  const_reference pvVar2;
  allocator local_27;
  allocator local_26;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  
  if (LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_,"DISABLED",
                 &local_21);
      std::__cxx11::string::string
                ((string *)(LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems + 1)
                 ,"ERROR",&local_22);
      std::__cxx11::string::string
                ((string *)(LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems + 2)
                 ,"WARNING",&local_23);
      std::__cxx11::string::string
                ((string *)(LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems + 3)
                 ,"NOTICE",&local_24);
      std::__cxx11::string::string
                ((string *)(LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems + 4)
                 ,"INFO",&local_25);
      std::__cxx11::string::string
                ((string *)(LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems + 5)
                 ,"DEBUGGING",&local_26);
      std::__cxx11::string::string
                ((string *)(LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_._M_elems + 6)
                 ,"TRACE",&local_27);
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
                   ::~array,&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_);
    }
  }
  pvVar2 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
           ::at(&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_,(long)(int)level);
  return pvVar2;
}

Assistant:

static const std::string& LevelName(const LogLevel level) {
            static const std::array<std::string, 7> names =
                {{"DISABLED", "ERROR", "WARNING", "NOTICE", "INFO", "DEBUGGING", "TRACE"}};
            return names.at(static_cast<size_t>(level));
        }